

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

Node * __thiscall wasm::DataFlow::Graph::doVisitBinary(Graph *this,Binary *curr)

{
  Expression *pEVar1;
  Expression *pEVar2;
  Node *pNVar3;
  Node *value;
  Node *pNVar4;
  Binary *this_00;
  BinaryOp BVar5;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  
  BVar5 = curr->op;
  if ((ulong)BVar5 < 0x32) {
    if ((0x3ffffe1fffffU >> ((ulong)BVar5 & 0x3f) & 1) == 0) {
      switch(BVar5) {
      case GtSInt32:
        BVar5 = LtSInt32;
        break;
      case GtUInt32:
        BVar5 = LtUInt32;
        break;
      case GeSInt32:
        BVar5 = LeSInt32;
        break;
      case GeUInt32:
        BVar5 = LeUInt32;
        break;
      default:
        switch(BVar5) {
        case GtSInt64:
          BVar5 = LtSInt64;
          break;
        case GtUInt64:
          BVar5 = LtUInt64;
          break;
        case GeSInt64:
          BVar5 = LeSInt64;
          break;
        case GeUInt64:
          BVar5 = LeUInt64;
          break;
        default:
          handle_unreachable("unexpected op",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                             ,0x22b);
        }
      }
      pEVar1 = curr->left;
      pEVar2 = curr->right;
      this_00 = (Binary *)MixedArena::allocSpace(&this->module->allocator,0x28,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      this_00->op = BVar5;
      local_38 = SUB84(pEVar1,0);
      uStack_34 = (undefined4)((ulong)pEVar1 >> 0x20);
      uStack_30 = SUB84(pEVar2,0);
      *(undefined4 *)&this_00->left = uStack_30;
      *(undefined4 *)((long)&this_00->left + 4) = uStack_34;
      *(undefined4 *)&this_00->right = local_38;
      *(undefined4 *)((long)&this_00->right + 4) = uStack_34;
      Binary::finalize(this_00);
      pNVar3 = visitExpression(this,(Expression *)this_00);
      pNVar3->origin = (Expression *)curr;
    }
    else {
      pNVar3 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                         ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->left)
      ;
      value = expandFromI1(this,pNVar3,(Expression *)curr);
      pNVar3 = value;
      if (value->type != Bad) {
        pNVar3 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                           ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,
                            curr->right);
        pNVar3 = expandFromI1(this,pNVar3,(Expression *)curr);
        if (pNVar3->type != Bad) {
          pNVar4 = (Node *)operator_new(0x30);
          pNVar4->type = Expr;
          pNVar4->origin = (Expression *)0x0;
          (pNVar4->values).
          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pNVar4->values).
          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pNVar4->values).
          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pNVar4->field_1).expr = (Expression *)curr;
          pNVar4->origin = (Expression *)curr;
          pNVar4 = addNode(this,pNVar4);
          Node::addValue(pNVar4,value);
          Node::addValue(pNVar4,pNVar3);
          pNVar3 = pNVar4;
        }
      }
    }
    return pNVar3;
  }
  pNVar3 = makeVar(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)16>).
                              super_Expression.type.id);
  return pNVar3;
}

Assistant:

Node* doVisitBinary(Binary* curr) {
    // First, check if we support this op.
    switch (curr->op) {
      case AddInt32:
      case AddInt64:
      case SubInt32:
      case SubInt64:
      case MulInt32:
      case MulInt64:
      case DivSInt32:
      case DivSInt64:
      case DivUInt32:
      case DivUInt64:
      case RemSInt32:
      case RemSInt64:
      case RemUInt32:
      case RemUInt64:
      case AndInt32:
      case AndInt64:
      case OrInt32:
      case OrInt64:
      case XorInt32:
      case XorInt64:
      case ShlInt32:
      case ShlInt64:
      case ShrUInt32:
      case ShrUInt64:
      case ShrSInt32:
      case ShrSInt64:
      case RotLInt32:
      case RotLInt64:
      case RotRInt32:
      case RotRInt64:
      case EqInt32:
      case EqInt64:
      case NeInt32:
      case NeInt64:
      case LtSInt32:
      case LtSInt64:
      case LtUInt32:
      case LtUInt64:
      case LeSInt32:
      case LeSInt64:
      case LeUInt32:
      case LeUInt64: {
        // These are ok as-is.
        // Check if our children are supported.
        auto* left = expandFromI1(visit(curr->left), curr);
        if (left->isBad()) {
          return left;
        }
        auto* right = expandFromI1(visit(curr->right), curr);
        if (right->isBad()) {
          return right;
        }
        // Great, we are supported!
        auto* ret = addNode(Node::makeExpr(curr, curr));
        ret->addValue(left);
        ret->addValue(right);
        return ret;
      }
      case GtSInt32:
      case GtSInt64:
      case GeSInt32:
      case GeSInt64:
      case GtUInt32:
      case GtUInt64:
      case GeUInt32:
      case GeUInt64: {
        // These need to be flipped as Souper does not support redundant ops.
        Builder builder(*module);
        BinaryOp opposite;
        switch (curr->op) {
          case GtSInt32:
            opposite = LtSInt32;
            break;
          case GtSInt64:
            opposite = LtSInt64;
            break;
          case GeSInt32:
            opposite = LeSInt32;
            break;
          case GeSInt64:
            opposite = LeSInt64;
            break;
          case GtUInt32:
            opposite = LtUInt32;
            break;
          case GtUInt64:
            opposite = LtUInt64;
            break;
          case GeUInt32:
            opposite = LeUInt32;
            break;
          case GeUInt64:
            opposite = LeUInt64;
            break;
          default:
            WASM_UNREACHABLE("unexpected op");
        }
        auto* ret =
          visitBinary(builder.makeBinary(opposite, curr->right, curr->left));
        // We just created a new binary node, but we need to set the origin
        // properly to the original.
        ret->origin = curr;
        return ret;
      }
      default: {
        // Anything else is an unknown value.
        return makeVar(curr->type);
      }
    }
  }